

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

vector<RPCResult,_std::allocator<RPCResult>_> * ScriptPubKeyDoc(void)

{
  initializer_list<RPCResult> __l;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffff9fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa10;
  allocator_type *in_stack_fffffffffffffa30;
  long *plVar2;
  allocator<char> *in_stack_fffffffffffffa38;
  long *plVar3;
  char *in_stack_fffffffffffffa40;
  undefined7 in_stack_fffffffffffffa48;
  undefined7 uVar4;
  undefined1 in_stack_fffffffffffffa4f;
  undefined1 uVar5;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa58;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffa60;
  vector<RPCResult,_std::allocator<RPCResult>_> *inner;
  string *in_stack_fffffffffffffa68;
  string *m_key_name;
  string *in_stack_fffffffffffffa70;
  string *m_key_name_00;
  undefined8 in_stack_fffffffffffffa78;
  Type TVar6;
  RPCResult *this;
  RPCResult *in_stack_fffffffffffffa80;
  RPCResult *this_00;
  undefined1 local_4d9;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined1 local_4b9 [9];
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined1 local_49a;
  undefined1 local_499 [32];
  allocator<char> local_479;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  allocator<char> local_45a;
  allocator<char> local_459;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  allocator<char> local_432;
  allocator<char> local_431 [385];
  long local_2b0 [51];
  RPCResult local_118;
  undefined1 local_90 [136];
  long local_8;
  
  TVar6 = (Type)((ulong)in_stack_fffffffffffffa78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),in_stack_fffffffffffffa40
             ,in_stack_fffffffffffffa38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),in_stack_fffffffffffffa40
             ,in_stack_fffffffffffffa38);
  local_458 = 0;
  uStack_450 = 0;
  local_448 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  RPCResult::RPCResult
            (in_stack_fffffffffffffa80,TVar6,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
             in_stack_fffffffffffffa60,SUB81((ulong)in_stack_fffffffffffffa58 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),in_stack_fffffffffffffa40
             ,in_stack_fffffffffffffa38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),in_stack_fffffffffffffa40
             ,in_stack_fffffffffffffa38);
  local_478 = 0;
  uStack_470 = 0;
  local_468 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  RPCResult::RPCResult
            (in_stack_fffffffffffffa80,TVar6,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
             in_stack_fffffffffffffa60,SUB81((ulong)in_stack_fffffffffffffa58 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),in_stack_fffffffffffffa40
             ,in_stack_fffffffffffffa38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),in_stack_fffffffffffffa40
             ,in_stack_fffffffffffffa38);
  local_499._1_8_ = 0;
  local_499._9_8_ = 0;
  local_499._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  RPCResult::RPCResult
            (in_stack_fffffffffffffa80,TVar6,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
             in_stack_fffffffffffffa60,SUB81((ulong)in_stack_fffffffffffffa58 >> 0x38,0));
  uVar5 = (undefined1)((ulong)in_stack_fffffffffffffa60 >> 0x38);
  this = &local_118;
  this_00 = (RPCResult *)local_499;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),in_stack_fffffffffffffa40
             ,in_stack_fffffffffffffa38);
  m_key_name_00 = (string *)&local_49a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),in_stack_fffffffffffffa40
             ,in_stack_fffffffffffffa38);
  local_4b9._1_8_ = 0;
  uStack_4b0 = 0;
  local_4a8 = 0;
  m_key_name = (string *)(local_4b9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
  uVar1 = 0;
  RPCResult::RPCResult
            (this,(Type)((ulong)m_key_name_00 >> 0x20),m_key_name,(bool)uVar5,
             in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,(bool)in_stack_fffffffffffffa4f);
  TVar6 = (Type)((ulong)this >> 0x20);
  uVar5 = (undefined1)((ulong)local_90 >> 0x38);
  inner = (vector<RPCResult,_std::allocator<RPCResult>_> *)local_4b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),in_stack_fffffffffffffa40
             ,in_stack_fffffffffffffa38);
  GetAllOutputTypes_abi_cxx11_();
  std::operator+((char *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  std::operator+(in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08);
  local_4d8 = 0;
  uStack_4d0 = 0;
  local_4c8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  RPCResult::RPCResult(this_00,TVar6,m_key_name_00,m_key_name,inner,(bool)uVar5);
  uVar4 = SUB87(&local_4d9,0);
  uVar5 = (undefined1)((ulong)&local_4d9 >> 0x38);
  std::allocator<RPCResult>::allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  __l._M_len._0_7_ = uVar4;
  __l._M_array = (iterator)in_stack_fffffffffffffa40;
  __l._M_len._7_1_ = uVar5;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa38,__l,
             in_stack_fffffffffffffa30);
  std::allocator<RPCResult>::~allocator
            ((allocator<RPCResult> *)CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  plVar3 = local_2b0;
  plVar2 = &local_8;
  do {
    plVar2 = plVar2 + -0x11;
    RPCResult::~RPCResult((RPCResult *)CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  } while (plVar2 != plVar3);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  std::allocator<char>::~allocator((allocator<char> *)local_4b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  std::allocator<char>::~allocator((allocator<char> *)&local_49a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  std::allocator<char>::~allocator((allocator<char> *)local_499);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  std::allocator<char>::~allocator((allocator<char> *)(local_499 + 0x1f));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  std::allocator<char>::~allocator(&local_479);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  std::allocator<char>::~allocator(&local_45a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  std::allocator<char>::~allocator(&local_459);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffa08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  std::allocator<char>::~allocator(&local_432);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff9fc,uVar1));
  std::allocator<char>::~allocator(local_431);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCResult> ScriptPubKeyDoc() {
    return
         {
             {RPCResult::Type::STR, "asm", "Disassembly of the output script"},
             {RPCResult::Type::STR, "desc", "Inferred descriptor for the output"},
             {RPCResult::Type::STR_HEX, "hex", "The raw output script bytes, hex-encoded"},
             {RPCResult::Type::STR, "address", /*optional=*/true, "The Bitcoin address (only if a well-defined address exists)"},
             {RPCResult::Type::STR, "type", "The type (one of: " + GetAllOutputTypes() + ")"},
         };
}